

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP2Connection.cpp
# Opt level: O0

ssize_t __thiscall HTTP2Connection::sendFrame(HTTP2Connection *this)

{
  int __fd;
  char *__buf;
  uint uVar1;
  ostream *poVar2;
  ssize_t sVar3;
  string local_30;
  HTTP2Connection *local_10;
  HTTP2Connection *this_local;
  
  local_10 = this;
  HTTP2Frame::getFrame((HTTP2Frame *)&stack0x00000008,this->sendBuffer);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)*this->sendBuffer);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)this->sendBuffer[1]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)this->sendBuffer[2]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)this->sendBuffer[3]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)this->sendBuffer[4]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Sending frame: ");
  HTTP2Frame::debugFrame_abi_cxx11_(&local_30,(HTTP2Frame *)&stack0x00000008,this->sendBuffer);
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  poVar2 = std::operator<<(poVar2," Size: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  uVar1 = HTTP2Frame::getSize((HTTP2Frame *)&stack0x00000008);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_30);
  __fd = this->socket;
  __buf = this->sendBuffer;
  uVar1 = HTTP2Frame::getSize((HTTP2Frame *)&stack0x00000008);
  sVar3 = write(__fd,__buf,(ulong)uVar1);
  return sVar3;
}

Assistant:

ssize_t HTTP2Connection::sendFrame(HTTP2Frame frame) {
    frame.getFrame(sendBuffer);
    std::cout<< std::hex << (int)sendBuffer[0] << " " << (int)sendBuffer[1] << " " << (int)sendBuffer[2] << " " << (int)sendBuffer[3] << " " << (int)sendBuffer[4]<< std::endl;
    std::cout << "Sending frame: " << frame.debugFrame(sendBuffer) << " Size: " << std::dec << frame.getSize() << std::endl;
    return write(socket, sendBuffer, frame.getSize());
}